

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  Config *pCVar3;
  TypeInfo *this;
  undefined8 uVar4;
  long in_RSI;
  int in_EDI;
  string *in_stack_00000040;
  ObjectFileDB db;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dgo_name;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dgos;
  string out_folder;
  TypeInfo *in_stack_00000218;
  string in_folder;
  value_type *in_stack_fffffffffffffd78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd98;
  ObjectFileDB *in_stack_fffffffffffffda0;
  ObjectFileDB *this_00;
  string *child;
  allocator *parent;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  string *in_stack_fffffffffffffdf8;
  ObjectFileDB *in_stack_fffffffffffffe00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe08;
  ObjectFileDB *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe28;
  ObjectFileDB *in_stack_fffffffffffffe30;
  string local_1c8 [32];
  string local_1a8 [184];
  string local_f0 [24];
  ObjectFileDB *in_stack_ffffffffffffff28;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b8;
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  printf("Jak Disassembler\n");
  init_crc();
  init_opcode_info();
  if (local_8 == 4) {
    pcVar1 = *(char **)(local_10 + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,pcVar1,&local_31);
    set_config(in_stack_00000040);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    pcVar1 = *(char **)(local_10 + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,pcVar1,&local_69);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    child = *(string **)(local_10 + 0x18);
    parent = &local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,(char *)child,parent);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x18e465);
    pCVar3 = get_config();
    local_b8 = &pCVar3->dgo_names;
    local_c0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffd78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffffd78);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffd80,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffd78);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_c0);
      combine_path((string *)parent,child);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      std::__cxx11::string::~string(local_f0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_c0);
    }
    ObjectFileDB::ObjectFileDB(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    this_00 = (ObjectFileDB *)&stack0xfffffffffffffe37;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c8,"dgo.txt",(allocator *)this_00);
    combine_path((string *)parent,child);
    ObjectFileDB::generate_dgo_listing_abi_cxx11_(in_stack_ffffffffffffff28);
    write_text_file((string *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe10);
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::string::~string(local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe37);
    ObjectFileDB::process_link_data
              ((ObjectFileDB *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    ObjectFileDB::find_code(in_stack_fffffffffffffe00);
    ObjectFileDB::process_labels(in_stack_fffffffffffffda0);
    pCVar3 = get_config();
    if ((pCVar3->write_scripts & 1U) != 0) {
      ObjectFileDB::find_and_write_scripts(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    }
    pCVar3 = get_config();
    if ((pCVar3->write_hexdump & 1U) != 0) {
      get_config();
      ObjectFileDB::write_object_file_words
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7
                );
    }
    ObjectFileDB::analyze_functions(this_00);
    pCVar3 = get_config();
    if ((pCVar3->write_disassembly & 1U) != 0) {
      get_config();
      ObjectFileDB::write_disassembly
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7
                );
    }
    this = get_type_info();
    TypeInfo::get_summary_abi_cxx11_(in_stack_00000218);
    uVar4 = std::__cxx11::string::c_str();
    printf("%s\n",uVar4);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf0);
    local_4 = 0;
    ObjectFileDB::~ObjectFileDB((ObjectFileDB *)this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)pCVar3);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_68);
  }
  else {
    printf("usage: jak_disassembler <config_file> <in_folder> <out_folder>\n");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
  printf("Jak Disassembler\n");
  init_crc();
  init_opcode_info();

  if (argc != 4) {
    printf("usage: jak_disassembler <config_file> <in_folder> <out_folder>\n");
    return 1;
  }

  set_config(argv[1]);
  std::string in_folder = argv[2];
  std::string out_folder = argv[3];

  std::vector<std::string> dgos;
  for (const auto& dgo_name : get_config().dgo_names) {
    dgos.push_back(combine_path(in_folder, dgo_name));
  }

  ObjectFileDB db(dgos);
  write_text_file(combine_path(out_folder, "dgo.txt"), db.generate_dgo_listing());

  db.process_link_data();
  db.find_code();
  db.process_labels();

  if (get_config().write_scripts) {
    db.find_and_write_scripts(out_folder);
  }

  if (get_config().write_hexdump) {
    db.write_object_file_words(out_folder, get_config().write_hexdump_on_v3_only);
  }

  db.analyze_functions();

  if (get_config().write_disassembly) {
    db.write_disassembly(out_folder, get_config().disassemble_objects_without_functions);
  }

  printf("%s\n", get_type_info().get_summary().c_str());

  return 0;
}